

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void lowbd_inv_txfm2d_add_16x4_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size_,int eob)

{
  longlong lVar1;
  longlong lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte in_CL;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int i;
  __m128i temp [16];
  __m128i buf_32_hi;
  __m128i buf_32_lo;
  __m128i buf_hi;
  __m128i buf_lo;
  int j;
  __m128i ones;
  __m128i scale;
  int row_one_loop;
  int lr_flip;
  int ud_flip;
  transform_1d_ssse3 col_txfm;
  transform_1d_ssse3 row_txfm;
  int buf_size_w_div8;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  TX_SIZE tx_size;
  __m128i buf [16];
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  undefined2 in_stack_fffffffffffffbe0;
  undefined2 in_stack_fffffffffffffbe2;
  undefined4 in_stack_fffffffffffffbe4;
  int iVar9;
  int in_stack_fffffffffffffbec;
  int32_t *in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffc14;
  int in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  uint8_t *in_stack_fffffffffffffc20;
  __m128i *in_stack_fffffffffffffc28;
  int local_2cc;
  int local_298;
  int local_294;
  transform_1d_ssse3 local_290;
  transform_1d_ssse3 local_288;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 local_274;
  int local_270;
  int local_26c;
  char *local_268;
  undefined1 local_259;
  longlong local_258 [34];
  byte local_145;
  undefined2 local_12e;
  undefined4 local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  longlong lStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  longlong local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_9c;
  undefined1 local_98 [16];
  undefined4 local_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_259 = 0xe;
  local_268 = av1_inv_txfm_shift_ls[0xe];
  local_145 = in_CL;
  local_26c = get_txw_idx('\x0e');
  local_270 = get_txh_idx('\x0e');
  local_274 = 0x10;
  local_278 = 4;
  local_27c = 2;
  local_288 = lowbd_txfm_all_1d_w4_arr[local_26c][""[local_145]];
  local_290 = lowbd_txfm_all_1d_w8_arr[local_270][""[local_145]];
  get_flip_cfg(local_145,&local_294,&local_298);
  load_buffer_32bit_to_16bit_w4
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
             (__m128i *)
             CONCAT44(in_stack_fffffffffffffbe4,
                      CONCAT22(in_stack_fffffffffffffbe2,in_stack_fffffffffffffbe0)),
             in_stack_fffffffffffffbdc);
  if (local_288 == iidentity16_ssse3) {
    local_12c = 0x18002d42;
    local_4 = 0x18002d42;
    local_8 = 0x18002d42;
    local_c = 0x18002d42;
    local_10 = 0x18002d42;
    local_28 = 0x18002d4218002d42;
    uStack_20 = 0x18002d4218002d42;
    local_12e = 1;
    local_2a = 1;
    local_2c = 1;
    local_2e = 1;
    local_30 = 1;
    local_32 = 1;
    local_34 = 1;
    local_36 = 1;
    local_38 = 1;
    local_48 = 0x1000100010001;
    uStack_40 = 0x1000100010001;
    for (local_2cc = 0; local_2cc < 0x10; local_2cc = local_2cc + 1) {
      lVar1 = local_258[(long)local_2cc * 2];
      lStack_110 = local_258[(long)local_2cc * 2 + 1];
      local_118._0_2_ = (undefined2)lVar1;
      local_118._2_2_ = (undefined2)((ulong)lVar1 >> 0x10);
      local_118._4_2_ = (undefined2)((ulong)lVar1 >> 0x20);
      local_118._6_2_ = (undefined2)((ulong)lVar1 >> 0x30);
      local_f8 = local_258[(long)local_2cc * 2];
      lVar2 = local_258[(long)local_2cc * 2 + 1];
      uStack_f0._0_2_ = (undefined2)lVar2;
      uStack_f0._2_2_ = (undefined2)((ulong)lVar2 >> 0x10);
      uStack_f0._4_2_ = (undefined2)((ulong)lVar2 >> 0x20);
      uStack_f0._6_2_ = (undefined2)((ulong)lVar2 >> 0x30);
      local_b8 = CONCAT26(1,CONCAT24(local_118._2_2_,CONCAT22(1,(undefined2)local_118)));
      uStack_b0 = CONCAT26(1,CONCAT24(local_118._6_2_,CONCAT22(1,local_118._4_2_)));
      auVar4._8_8_ = uStack_b0;
      auVar4._0_8_ = local_b8;
      auVar7._8_8_ = 0x18002d4218002d42;
      auVar7._0_8_ = 0x18002d4218002d42;
      local_78 = pmaddwd(auVar4,auVar7);
      local_7c = 0xd;
      auVar7 = ZEXT416(0xd);
      local_d8 = CONCAT26(1,CONCAT24(uStack_f0._2_2_,CONCAT22(1,(undefined2)uStack_f0)));
      uStack_d0 = CONCAT26(1,CONCAT24(uStack_f0._6_2_,CONCAT22(1,uStack_f0._4_2_)));
      auVar3._8_8_ = uStack_d0;
      auVar3._0_8_ = local_d8;
      auVar8._8_8_ = 0x18002d4218002d42;
      auVar8._0_8_ = 0x18002d4218002d42;
      local_98 = pmaddwd(auVar3,auVar8);
      local_9c = 0xd;
      auVar8 = ZEXT416(0xd);
      local_58 = CONCAT44((int)local_78._4_4_ >> auVar7,(int)local_78._0_4_ >> auVar7);
      uStack_50 = CONCAT44((int)local_78._12_4_ >> auVar7,(int)local_78._8_4_ >> auVar7);
      local_68 = CONCAT44((int)local_98._4_4_ >> auVar8,(int)local_98._0_4_ >> auVar8);
      uStack_60 = CONCAT44((int)local_98._12_4_ >> auVar8,(int)local_98._8_4_ >> auVar8);
      auVar6._8_8_ = uStack_50;
      auVar6._0_8_ = local_58;
      auVar5._8_8_ = uStack_60;
      auVar5._0_8_ = local_68;
      auVar8 = packssdw(auVar6,auVar5);
      *(undefined1 (*) [16])(local_258 + (long)local_2cc * 2) = auVar8;
      local_128 = local_48;
      uStack_120 = uStack_40;
      local_118 = lVar1;
      local_108 = local_48;
      uStack_100 = uStack_40;
      uStack_f0 = lVar2;
      local_e8 = local_28;
      uStack_e0 = uStack_20;
      local_c8 = local_28;
      uStack_c0 = uStack_20;
    }
  }
  else {
    (*local_288)((__m128i *)local_258,(__m128i *)local_258);
    round_shift_16bit_ssse3((__m128i *)local_258,0x10,(int)*local_268);
  }
  if (local_298 == 0) {
    transpose_16bit_4x8((__m128i *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                        (__m128i *)0x754dbd);
    transpose_16bit_4x8((__m128i *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                        (__m128i *)0x754de0);
  }
  else {
    flip_buf_sse2((__m128i *)local_258,(__m128i *)&stack0xfffffffffffffbe8,0x10);
    transpose_16bit_4x8((__m128i *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                        (__m128i *)0x754d86);
    transpose_16bit_4x8((__m128i *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                        (__m128i *)0x754da6);
  }
  for (iVar9 = 0; iVar9 < 2; iVar9 = iVar9 + 1) {
    (*local_290)((__m128i *)(local_258 + (long)(iVar9 << 3) * 2),
                 (__m128i *)(local_258 + (long)(iVar9 << 3) * 2));
    round_shift_16bit_ssse3((__m128i *)(local_258 + (long)(iVar9 << 3) * 2),4,(int)local_268[1]);
  }
  lowbd_write_buffer_8xn_sse2
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c,
             in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
  lowbd_write_buffer_8xn_sse2
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c,
             in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
  return;
}

Assistant:

static void lowbd_inv_txfm2d_add_16x4_ssse3(const int32_t *input,
                                            uint8_t *output, int stride,
                                            TX_TYPE tx_type, TX_SIZE tx_size_,
                                            int eob) {
  (void)tx_size_;
  (void)eob;
  __m128i buf[16];
  const TX_SIZE tx_size = TX_16X4;
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = txfm_size_col >> 3;

  const transform_1d_ssse3 row_txfm =
      lowbd_txfm_all_1d_w4_arr[txw_idx][hitx_1d_tab[tx_type]];
  const transform_1d_ssse3 col_txfm =
      lowbd_txfm_all_1d_w8_arr[txh_idx][vitx_1d_tab[tx_type]];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  const int row_one_loop = 8;
  load_buffer_32bit_to_16bit_w4(input, txfm_size_row, buf, txfm_size_col);
  if (row_txfm == iidentity16_ssse3) {
    const __m128i scale = pair_set_epi16(2 * NewSqrt2, 3 << (NewSqrt2Bits - 1));
    const __m128i ones = _mm_set1_epi16(1);
    for (int j = 0; j < 16; ++j) {
      const __m128i buf_lo = _mm_unpacklo_epi16(buf[j], ones);
      const __m128i buf_hi = _mm_unpackhi_epi16(buf[j], ones);
      const __m128i buf_32_lo =
          _mm_srai_epi32(_mm_madd_epi16(buf_lo, scale), (NewSqrt2Bits + 1));
      const __m128i buf_32_hi =
          _mm_srai_epi32(_mm_madd_epi16(buf_hi, scale), (NewSqrt2Bits + 1));
      buf[j] = _mm_packs_epi32(buf_32_lo, buf_32_hi);
    }
  } else {
    row_txfm(buf, buf);
    round_shift_16bit_ssse3(buf, txfm_size_col, shift[0]);
  }
  if (lr_flip) {
    __m128i temp[16];
    flip_buf_sse2(buf, temp, 16);
    transpose_16bit_4x8(temp, buf);
    transpose_16bit_4x8(temp + 8, buf + 8);
  } else {
    transpose_16bit_4x8(buf, buf);
    transpose_16bit_4x8(buf + row_one_loop, buf + row_one_loop);
  }
  for (int i = 0; i < buf_size_w_div8; i++) {
    col_txfm(buf + i * row_one_loop, buf + i * row_one_loop);
    round_shift_16bit_ssse3(buf + i * row_one_loop, txfm_size_row, shift[1]);
  }
  lowbd_write_buffer_8xn_sse2(buf, output, stride, ud_flip, 4);
  lowbd_write_buffer_8xn_sse2(buf + 8, output + 8, stride, ud_flip, 4);
}